

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

Var Js::TypedArrayBase::EntryForEach(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  TypedArrayBase *pTVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  undefined4 extraout_var;
  JavascriptMethod p_Var9;
  uint nValue;
  int in_stack_00000010;
  undefined1 local_98 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  undefined1 local_60 [8];
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x743,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bf901e;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_60,(CallInfo *)&__tag.entry.next,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_98,function,(CallInfo)__tag.entry.next,
             L"[TypedArray].prototype.forEach",&stack0x00000000);
  if (((ulong)__tag.entry.next & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x747,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bf901e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pTVar6 = ValidateTypedArray((Arguments *)local_60,pSVar1,L"[TypedArray].prototype.forEach");
  if ((local_60._0_4_ & 0xfffffe) != 0) {
    args.super_Arguments.Values._4_4_ = (pTVar6->super_ArrayBufferParent).super_ArrayObject.length;
    pvVar7 = Arguments::operator[]((Arguments *)local_60,1);
    bVar3 = JavascriptConversion::IsCallable(pvVar7);
    if (bVar3) {
      pvVar7 = Arguments::operator[]((Arguments *)local_60,1);
      pRVar8 = VarTo<Js::RecyclableObject>(pvVar7);
      if ((local_60._0_4_ & 0xffffff) < 3) {
        callInfo_local =
             (CallInfo)
             (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
      }
      else {
        callInfo_local = (CallInfo)Arguments::operator[]((Arguments *)local_60,2);
      }
      for (nValue = 0; args.super_Arguments.Values._4_4_ != nValue; nValue = nValue + 1) {
        iVar4 = (*(pTVar6->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(pTVar6,(ulong)nValue);
        this = pSVar1->threadContext;
        bVar3 = this->reentrancySafeOrHandled;
        this->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
        ThreadContext::AssertJsReentrancy(pSVar1->threadContext);
        p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
        CheckIsExecutable(pRVar8,p_Var9);
        p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
        pvVar7 = JavascriptNumber::ToVar(nValue,pSVar1);
        (*p_Var9)(pRVar8,(CallInfo)pRVar8,0x2000004,0,0,0,0,0x2000004,callInfo_local,
                  CONCAT44(extraout_var,iVar4),pvVar7,pTVar6);
        this->reentrancySafeOrHandled = bVar3;
      }
      pRVar8 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
      AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_98);
      return pRVar8;
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec34,L"[TypedArray].prototype.forEach");
}

Assistant:

Var TypedArrayBase::EntryForEach(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("[TypedArray].prototype.forEach"));

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(TypedArray_Prototype_forEach);

        TypedArrayBase* typedArrayBase = ValidateTypedArray(args, scriptContext, _u("[TypedArray].prototype.forEach"));
        uint32 length = typedArrayBase->GetLength();

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.forEach"));
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        for (uint32 k = 0; k < length; k++)
        {
            // No need for HasItem, as we have already established that this API can be called only on the TypedArray object. So Proxy scenario cannot happen.

            Var element = typedArrayBase->DirectGetItem(k);

            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                CALL_FUNCTION(scriptContext->GetThreadContext(),
                    callBackFn, CallInfo(CallFlags_Value, 4),
                    thisArg,
                    element,
                    JavascriptNumber::ToVar(k, scriptContext),
                    typedArrayBase);
            }
            END_SAFE_REENTRANT_CALL
        }

        return scriptContext->GetLibrary()->GetUndefined();
    }